

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall E64::stats_t::process_parameters(stats_t *this)

{
  long in_RDI;
  
  *(char *)(in_RDI + 0x50) = *(char *)(in_RDI + 0x50) + '\x01';
  if (*(char *)(in_RDI + 0x50) == *(char *)(in_RDI + 0x51)) {
    *(undefined1 *)(in_RDI + 0x50) = 0;
    *(double *)(in_RDI + 0x68) =
         (double)((uint)*(byte *)(in_RDI + 0x51) * 1000000) / (double)*(long *)(in_RDI + 0x28);
    *(double *)(in_RDI + 0x70) =
         *(double *)(in_RDI + 0x58) * *(double *)(in_RDI + 0x70) +
         (1.0 - *(double *)(in_RDI + 0x58)) * *(double *)(in_RDI + 0x68);
    *(double *)(in_RDI + 0x88) =
         (double)(*(long *)(in_RDI + 0x30) / (long)(ulong)*(byte *)(in_RDI + 0x51));
    *(double *)(in_RDI + 0x98) =
         (double)(*(long *)(in_RDI + 0x38) / (long)(ulong)*(byte *)(in_RDI + 0x51));
    *(double *)(in_RDI + 0xa8) =
         (double)(*(long *)(in_RDI + 0x40) / (long)(ulong)*(byte *)(in_RDI + 0x51));
    *(double *)(in_RDI + 0xb8) =
         (double)(*(long *)(in_RDI + 0x48) / (long)(ulong)*(byte *)(in_RDI + 0x51));
    *(double *)(in_RDI + 0x90) =
         *(double *)(in_RDI + 0x58) * *(double *)(in_RDI + 0x90) +
         (1.0 - *(double *)(in_RDI + 0x58)) * *(double *)(in_RDI + 0x88);
    *(double *)(in_RDI + 0xa0) =
         *(double *)(in_RDI + 0x58) * *(double *)(in_RDI + 0xa0) +
         (1.0 - *(double *)(in_RDI + 0x58)) * *(double *)(in_RDI + 0x98);
    *(double *)(in_RDI + 0xb0) =
         *(double *)(in_RDI + 0x58) * *(double *)(in_RDI + 0xb0) +
         (1.0 - *(double *)(in_RDI + 0x58)) * *(double *)(in_RDI + 0xa8);
    *(double *)(in_RDI + 0xc0) =
         *(double *)(in_RDI + 0x58) * *(double *)(in_RDI + 0xc0) +
         (1.0 - *(double *)(in_RDI + 0x58)) * *(double *)(in_RDI + 0xb8);
    *(double *)(in_RDI + 0x80) =
         *(double *)(in_RDI + 0x58) * *(double *)(in_RDI + 0x80) +
         (1.0 - *(double *)(in_RDI + 0x58)) * *(double *)(in_RDI + 0x78);
    *(double *)(in_RDI + 200) =
         ((*(double *)(in_RDI + 0x90) + *(double *)(in_RDI + 0xa0) + *(double *)(in_RDI + 0xb0)) *
         100.0) / (*(double *)(in_RDI + 0x90) + *(double *)(in_RDI + 0xa0) +
                   *(double *)(in_RDI + 0xb0) + *(double *)(in_RDI + 0xc0));
    *(undefined8 *)(in_RDI + 0x48) = 0;
    *(undefined8 *)(in_RDI + 0x40) = 0;
    *(undefined8 *)(in_RDI + 0x38) = 0;
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  *(char *)(in_RDI + 0x52) = *(char *)(in_RDI + 0x52) + '\x01';
  if (*(char *)(in_RDI + 0x52) == *(char *)(in_RDI + 0x53)) {
    *(undefined1 *)(in_RDI + 0x52) = 0;
    snprintf((char *)(in_RDI + 0xd0),0x100,
             "\n      sound: %5.2f ms     cpu load:%6.2f %%\n       core: %5.2f ms  audiobuffer: %5.2f kb\n   textures: %5.2f ms    framerate:%6.2f fps\n  frametime: %5.2f ms"
             ,*(double *)(in_RDI + 0x90) / 1000.0,*(undefined8 *)(in_RDI + 200),
             *(double *)(in_RDI + 0xa0) / 1000.0,*(double *)(in_RDI + 0x80) / 1024.0,
             *(double *)(in_RDI + 0xb0) / 1000.0,*(undefined8 *)(in_RDI + 0x70),
             (*(double *)(in_RDI + 0x90) + *(double *)(in_RDI + 0xa0) + *(double *)(in_RDI + 0xb0) +
             *(double *)(in_RDI + 0xc0)) / 1000.0);
  }
  return;
}

Assistant:

void E64::stats_t::process_parameters()
{
	framecounter++;
	
	if (framecounter == framecounter_interval) {
		framecounter = 0;

		framerate = (double)(framecounter_interval * 1000000) / total_time;
		
		smoothed_framerate =
			(alpha * smoothed_framerate) +
			((1.0 - alpha) * framerate);
        
		sound_per_frame = total_sound_time / framecounter_interval;
		core_per_frame = total_core_time / framecounter_interval;
		textures_per_frame = total_textures_time / framecounter_interval;
		idle_per_frame = total_idle_time / framecounter_interval;
		
		smoothed_sound_per_frame =
			(alpha * smoothed_sound_per_frame) +
			((1.0 - alpha) * sound_per_frame);
		
		smoothed_core_per_frame =
			(alpha * smoothed_core_per_frame) +
			((1.0 - alpha) * core_per_frame);
		
		smoothed_textures_per_frame =
			(alpha * smoothed_textures_per_frame) +
			((1.0 - alpha) * textures_per_frame);
		
		smoothed_idle_per_frame =
			(alpha * smoothed_idle_per_frame) +
			((1.0 - alpha) * idle_per_frame);
		
		smoothed_audio_queue_size_bytes =
			(alpha * smoothed_audio_queue_size_bytes) +
			((1.0 - alpha) * audio_queue_size_bytes);
		
		cpu_percentage = 100 * (smoothed_sound_per_frame + smoothed_core_per_frame + smoothed_textures_per_frame) / (smoothed_sound_per_frame + smoothed_core_per_frame + smoothed_textures_per_frame + smoothed_idle_per_frame);
        
		total_time = total_sound_time = total_core_time = total_textures_time = total_idle_time = 0;
	}

	status_bar_framecounter++;

	if (status_bar_framecounter == status_bar_framecounter_interval) {
		status_bar_framecounter = 0;

		snprintf(statistics_string, 256,
			"\n      sound: %5.2f ms     cpu load:%6.2f %%\n"
			"       core: %5.2f ms  audiobuffer: %5.2f kb\n"
			"   textures: %5.2f ms    framerate:%6.2f fps\n"
			"  frametime: %5.2f ms",
			smoothed_sound_per_frame/1000, cpu_percentage,
			smoothed_core_per_frame/1000, smoothed_audio_queue_size_bytes/1024,
			 smoothed_textures_per_frame/1000, smoothed_framerate,
			 (smoothed_sound_per_frame+smoothed_core_per_frame+smoothed_textures_per_frame+smoothed_idle_per_frame)/1000);
	}
}